

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetTxInFinalScript
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this,uint32_t index,bool is_witness_stack)

{
  ByteData local_58;
  ulong local_40;
  size_t stack_idx;
  wally_tx_witness_stack *stacks;
  void *local_28;
  wally_psbt *psbt_pointer;
  bool is_witness_stack_local;
  Psbt *pPStack_18;
  uint32_t index_local;
  Psbt *this_local;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *result;
  
  psbt_pointer._3_1_ = is_witness_stack;
  psbt_pointer._4_4_ = index;
  pPStack_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xae3,"GetTxInFinalScript");
  local_28 = this->wally_psbt_pointer_;
  stacks._7_1_ = 0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (__return_storage_ptr__);
  if ((psbt_pointer._3_1_ & 1) == 0) {
    ByteData::ByteData((ByteData *)&stack0xffffffffffffff80,
                       *(uint8_t **)
                        (*(long *)((long)local_28 + 0x10) + 0x30 + (ulong)psbt_pointer._4_4_ * 0x110
                        ),*(uint32_t *)
                           (*(long *)((long)local_28 + 0x10) + 0x38 +
                           (ulong)psbt_pointer._4_4_ * 0x110));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)&stack0xffffffffffffff80);
    ByteData::~ByteData((ByteData *)0x478bd1);
  }
  else {
    stack_idx = *(size_t *)
                 (*(long *)((long)local_28 + 0x10) + (ulong)psbt_pointer._4_4_ * 0x110 + 0x40);
    if (stack_idx != 0) {
      for (local_40 = 0; local_40 < *(ulong *)(stack_idx + 8); local_40 = local_40 + 1) {
        ByteData::ByteData(&local_58,*(uint8_t **)(*(long *)stack_idx + local_40 * 0x10),
                           *(uint32_t *)(*(long *)stack_idx + 8 + local_40 * 0x10));
        ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_58);
        ByteData::~ByteData((ByteData *)0x478b59);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetTxInFinalScript(
    uint32_t index, bool is_witness_stack) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;

  if (is_witness_stack) {
    auto stacks = psbt_pointer->inputs[index].final_witness;
    if (stacks != nullptr) {
      for (size_t stack_idx = 0; stack_idx < stacks->num_items; ++stack_idx) {
        result.emplace_back(ByteData(
            stacks->items[stack_idx].witness,
            static_cast<uint32_t>(stacks->items[stack_idx].witness_len)));
      }
    }
  } else {
    result.emplace_back(ByteData(
        psbt_pointer->inputs[index].final_scriptsig,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].final_scriptsig_len)));
  }
  return result;
}